

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::
       fill<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,FixedArray<char,_1UL> *first,ArrayPtr<const_char> *rest,
                 ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
                 ArrayPtr<const_char> *rest_3)

{
  size_t sVar1;
  char *__dest;
  
  *target = first->content[0];
  __dest = target + 1;
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    memcpy(__dest,rest->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(__dest,rest_1->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = rest_2->size_;
  if (sVar1 != 0) {
    memcpy(__dest,rest_2->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = rest_3->size_;
  if (sVar1 != 0) {
    memcpy(__dest,rest_3->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  return __dest;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}